

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.c
# Opt level: O2

exr_result_t
internal_coding_fill_channel_info
          (exr_coding_channel_info_t **channels,int16_t *num_chans,
          exr_coding_channel_info_t *builtinextras,exr_chunk_info_t *cinfo,
          _internal_exr_context *pctxt,_internal_exr_part *part)

{
  uint uVar1;
  int iVar2;
  exr_attr_chlist_t *peVar3;
  exr_attr_chlist_entry_t *peVar4;
  int iVar5;
  int iVar6;
  exr_result_t eVar7;
  uint16_t *puVar8;
  size_t __n;
  ulong uVar9;
  long lVar10;
  
  peVar3 = (part->channels->field_6).chlist;
  uVar1 = peVar3->num_channels;
  if (5 < (long)(int)uVar1) {
    __n = (long)(int)uVar1 * 0x30;
    builtinextras = (exr_coding_channel_info_t *)(*pctxt->alloc_fn)(__n);
    if (builtinextras == (exr_coding_channel_info_t *)0x0) {
      eVar7 = (*pctxt->standard_error)(pctxt,1);
      return eVar7;
    }
    memset(builtinextras,0,__n);
  }
  lVar10 = 0;
  uVar9 = 0;
  if (0 < (int)uVar1) {
    uVar9 = (ulong)uVar1;
  }
  puVar8 = &builtinextras->user_data_type;
  for (; uVar9 * 0x20 != lVar10; lVar10 = lVar10 + 0x20) {
    peVar4 = peVar3->entries;
    ((exr_coding_channel_info_t *)(puVar8 + -0xf))->channel_name =
         *(char **)(peVar4->reserved + lVar10 + -0xd);
    iVar2 = *(int *)(peVar4->reserved + lVar10 + 7);
    iVar5 = compute_sampled_lines(cinfo->height,iVar2,cinfo->start_y);
    *(int *)(puVar8 + -0xb) = iVar5;
    iVar5 = *(int *)(peVar4->reserved + lVar10 + 3);
    iVar6 = cinfo->width;
    if (1 < iVar5) {
      iVar6 = iVar6 / iVar5;
    }
    *(int *)(puVar8 + -9) = iVar6;
    *(int *)(puVar8 + -7) = iVar5;
    *(int *)(puVar8 + -5) = iVar2;
    *(uint8_t *)(puVar8 + -3) = peVar4->reserved[lVar10 + -1];
    iVar2 = *(int *)(peVar4->reserved + lVar10 + -5);
    *(char *)((long)puVar8 + -5) = (iVar2 != 1) * '\x02' + '\x02';
    puVar8[-2] = (uint16_t)iVar2;
    puVar8[-1] = (ushort)(iVar2 != 1) * 2 + 2;
    *puVar8 = (uint16_t)iVar2;
    puVar8 = puVar8 + 0x18;
  }
  *channels = builtinextras;
  *num_chans = (int16_t)uVar1;
  return 0;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

exr_result_t
internal_coding_fill_channel_info (
    exr_coding_channel_info_t**         channels,
    int16_t*                            num_chans,
    exr_coding_channel_info_t*          builtinextras,
    const exr_chunk_info_t*             cinfo,
    const struct _internal_exr_context* pctxt,
    const struct _internal_exr_part*    part)
{
    int                        chans;
    exr_attr_chlist_t*         chanlist;
    exr_coding_channel_info_t* chanfill;

    chanlist = part->channels->chlist;
    chans    = chanlist->num_channels;
    if (chans <= 5) { chanfill = builtinextras; }
    else
    {
        chanfill = (exr_coding_channel_info_t*) pctxt->alloc_fn (
            (size_t) (chans) * sizeof (exr_coding_channel_info_t));
        if (chanfill == NULL)
            return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
        memset (
            chanfill, 0, (size_t) (chans) * sizeof (exr_coding_channel_info_t));
    }

    for (int c = 0; c < chans; ++c)
    {
        const exr_attr_chlist_entry_t* curc = (chanlist->entries + c);
        exr_coding_channel_info_t*     decc = (chanfill + c);

        decc->channel_name = curc->name.str;

        decc->height = compute_sampled_lines (
            cinfo->height, curc->y_sampling, cinfo->start_y);

        if (curc->x_sampling > 1)
            decc->width = cinfo->width / curc->x_sampling;
        else
            decc->width = cinfo->width;

        decc->x_samples         = curc->x_sampling;
        decc->y_samples         = curc->y_sampling;
        decc->p_linear          = curc->p_linear;
        decc->bytes_per_element = (curc->pixel_type == EXR_PIXEL_HALF) ? 2 : 4;
        decc->data_type         = (uint16_t) (curc->pixel_type);

        /* initialize these so they don't trip us up during decoding
         * when the user also chooses to skip a channel */
        decc->user_bytes_per_element = decc->bytes_per_element;
        decc->user_data_type         = decc->data_type;
        /* but leave the rest as zero for the user to fill in */
    }

    *channels  = chanfill;
    *num_chans = (int16_t) chans;

    return EXR_ERR_SUCCESS;
}